

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_client.h
# Opt level: O1

void __thiscall spdlog::details::udp_client::udp_client(udp_client *this,string *host,uint16_t port)

{
  int iVar1;
  int option_value;
  undefined4 local_7c;
  string local_78;
  string local_58;
  string local_38;
  
  this->socket_ = -1;
  iVar1 = socket(2,2,0);
  this->socket_ = iVar1;
  if (iVar1 < 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"error: Create Socket Failed!","");
    throw_spdlog_ex(&local_38);
  }
  local_7c = 0x2800;
  iVar1 = setsockopt(iVar1,1,7,&local_7c,4);
  if (-1 < iVar1) {
    (this->sockAddr_).sin_family = 2;
    (this->sockAddr_).sin_port = port << 8 | port >> 8;
    iVar1 = inet_aton((host->_M_dataplus)._M_p,(in_addr *)&(this->sockAddr_).sin_addr);
    if (iVar1 != 0) {
      (this->sockAddr_).sin_zero[0] = '\0';
      (this->sockAddr_).sin_zero[1] = '\0';
      (this->sockAddr_).sin_zero[2] = '\0';
      (this->sockAddr_).sin_zero[3] = '\0';
      (this->sockAddr_).sin_zero[4] = '\0';
      (this->sockAddr_).sin_zero[5] = '\0';
      (this->sockAddr_).sin_zero[6] = '\0';
      (this->sockAddr_).sin_zero[7] = '\0';
      return;
    }
    if (this->socket_ != -1) {
      close(this->socket_);
      this->socket_ = -1;
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"error: Invalid address!","");
    throw_spdlog_ex(&local_78);
  }
  if (this->socket_ != -1) {
    close(this->socket_);
    this->socket_ = -1;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"error: setsockopt(SO_SNDBUF) Failed!","");
  throw_spdlog_ex(&local_58);
}

Assistant:

udp_client(const std::string &host, uint16_t port)
    {
        socket_ = ::socket(PF_INET, SOCK_DGRAM, 0);
        if (socket_ < 0)
        {
            throw_spdlog_ex("error: Create Socket Failed!");
        }

        int option_value = TX_BUFFER_SIZE;
        if (::setsockopt(socket_, SOL_SOCKET, SO_SNDBUF, reinterpret_cast<const char *>(&option_value), sizeof(option_value)) < 0)
        {
            cleanup_();
            throw_spdlog_ex("error: setsockopt(SO_SNDBUF) Failed!");
        }

        sockAddr_.sin_family = AF_INET;
        sockAddr_.sin_port = htons(port);
        
        if (::inet_aton(host.c_str(), &sockAddr_.sin_addr) == 0) {
            cleanup_();
            throw_spdlog_ex("error: Invalid address!");
        }

        ::memset(sockAddr_.sin_zero, 0x00, sizeof(sockAddr_.sin_zero));
    }